

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_ssse3_intr.c
# Opt level: O1

void ihevcd_itrans_recon_dc_chroma_ssse3
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  UWORD8 *pUVar1;
  ulong uVar2;
  undefined8 uVar3;
  char cVar4;
  byte bVar12;
  undefined2 uVar13;
  undefined3 uVar14;
  undefined1 auVar15 [12];
  undefined4 uVar16;
  undefined1 auVar17 [12];
  undefined5 uVar18;
  undefined6 uVar19;
  undefined7 uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  undefined6 in_register_0000008a;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 uVar41;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar57;
  undefined1 auVar42 [16];
  short sVar58;
  undefined1 auVar50 [16];
  undefined1 auVar59 [16];
  short sVar60;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar61 [16];
  short sVar69;
  undefined1 auVar62 [16];
  short sVar70;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar71 [16];
  short sVar78;
  short sVar79;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar80 [16];
  short sVar101;
  undefined1 auVar89 [12];
  short sVar87;
  short sVar88;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar102;
  undefined1 auVar90 [16];
  short sVar103;
  undefined1 auVar91 [16];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  
  auVar39 = _DAT_00171750;
  iVar26 = 1 << ((byte)log2_trans_size & 0x1f);
  auVar27 = ZEXT416(((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40U >> 1) + 0x800
                    >> 0xc);
  auVar27 = pshuflw(auVar27,auVar27,0);
  sVar57 = auVar27._0_2_;
  sVar58 = auVar27._2_2_;
  if (log2_trans_size == 2) {
    uVar2 = *(ulong *)pu1_pred;
    lVar21 = (long)pred_strd;
    uVar3 = *(undefined8 *)(pu1_pred + lVar21);
    auVar38._8_6_ = 0;
    auVar38._0_8_ = uVar2;
    auVar38[0xe] = (char)(uVar2 >> 0x38);
    auVar38[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar37._14_2_ = auVar38._14_2_;
    auVar37._8_5_ = 0;
    auVar37._0_8_ = uVar2;
    auVar37[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar36._13_3_ = auVar37._13_3_;
    auVar36._8_4_ = 0;
    auVar36._0_8_ = uVar2;
    auVar36[0xc] = (char)(uVar2 >> 0x30);
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._8_3_ = 0;
    auVar35._0_8_ = uVar2;
    auVar35[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar34._11_5_ = auVar35._11_5_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar2;
    auVar34[10] = (char)(uVar2 >> 0x28);
    auVar33._10_6_ = auVar34._10_6_;
    auVar33[8] = 0;
    auVar33._0_8_ = uVar2;
    auVar33[9] = (char)((ulong)uVar3 >> 0x20);
    auVar32._9_7_ = auVar33._9_7_;
    auVar32[8] = (char)(uVar2 >> 0x20);
    auVar32._0_8_ = uVar2;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31[7] = (char)((ulong)uVar3 >> 0x18);
    auVar31[6] = (char)(uVar2 >> 0x18);
    auVar31[5] = (char)((ulong)uVar3 >> 0x10);
    auVar31[4] = (char)(uVar2 >> 0x10);
    auVar31[3] = (char)((ulong)uVar3 >> 8);
    auVar31[2] = (char)(uVar2 >> 8);
    auVar31[0] = (undefined1)uVar2;
    auVar31[1] = (char)uVar3;
    uVar2 = *(ulong *)(pu1_pred + lVar21 * 2);
    uVar3 = *(undefined8 *)(pu1_pred + lVar21 * 3);
    auVar49._8_6_ = 0;
    auVar49._0_8_ = uVar2;
    auVar49[0xe] = (char)(uVar2 >> 0x38);
    auVar49[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar48._14_2_ = auVar49._14_2_;
    auVar48._8_5_ = 0;
    auVar48._0_8_ = uVar2;
    auVar48[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar47._13_3_ = auVar48._13_3_;
    auVar47._8_4_ = 0;
    auVar47._0_8_ = uVar2;
    auVar47[0xc] = (char)(uVar2 >> 0x30);
    auVar46._12_4_ = auVar47._12_4_;
    auVar46._8_3_ = 0;
    auVar46._0_8_ = uVar2;
    auVar46[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar45._11_5_ = auVar46._11_5_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = uVar2;
    auVar45[10] = (char)(uVar2 >> 0x28);
    auVar44._10_6_ = auVar45._10_6_;
    auVar44[8] = 0;
    auVar44._0_8_ = uVar2;
    auVar44[9] = (char)((ulong)uVar3 >> 0x20);
    auVar43._9_7_ = auVar44._9_7_;
    auVar43[8] = (char)(uVar2 >> 0x20);
    auVar43._0_8_ = uVar2;
    auVar42._8_8_ = auVar43._8_8_;
    auVar42[7] = (char)((ulong)uVar3 >> 0x18);
    auVar42[6] = (char)(uVar2 >> 0x18);
    auVar42[5] = (char)((ulong)uVar3 >> 0x10);
    auVar42[4] = (char)(uVar2 >> 0x10);
    auVar42[3] = (char)((ulong)uVar3 >> 8);
    auVar42[2] = (char)(uVar2 >> 8);
    auVar42[0] = (undefined1)uVar2;
    auVar42[1] = (char)uVar3;
    auVar39 = pshufb(auVar31,_DAT_00171700);
    auVar27 = pshufb(auVar42,_DAT_00171700);
    sVar60 = auVar39._0_2_ + sVar57;
    sVar63 = auVar39._2_2_ + sVar58;
    sVar64 = auVar39._4_2_ + sVar57;
    sVar65 = auVar39._6_2_ + sVar58;
    sVar66 = auVar39._8_2_ + sVar57;
    sVar67 = auVar39._10_2_ + sVar58;
    sVar68 = auVar39._12_2_ + sVar57;
    sVar69 = auVar39._14_2_ + sVar58;
    sVar70 = auVar27._0_2_ + sVar57;
    sVar72 = auVar27._2_2_ + sVar58;
    sVar73 = auVar27._4_2_ + sVar57;
    sVar74 = auVar27._6_2_ + sVar58;
    sVar75 = auVar27._8_2_ + sVar57;
    sVar76 = auVar27._10_2_ + sVar58;
    sVar57 = auVar27._12_2_ + sVar57;
    sVar58 = auVar27._14_2_ + sVar58;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)pu1_dst;
    lVar21 = (long)dst_strd;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = *(ulong *)(pu1_dst + lVar21);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = *(ulong *)(pu1_dst + lVar21 * 2);
    uVar3 = *(undefined8 *)(pu1_dst + lVar21 * 3);
    cVar4 = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
    cVar5 = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
    cVar6 = (0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68);
    cVar7 = (0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69);
    cVar8 = (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70);
    uVar13 = CONCAT11(cVar8,cVar7);
    cVar9 = (0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72);
    uVar14 = CONCAT12(cVar9,uVar13);
    cVar10 = (0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73);
    uVar16 = CONCAT13(cVar10,uVar14);
    cVar11 = (0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74);
    uVar18 = CONCAT14(cVar11,uVar16);
    uVar19 = CONCAT15((0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75),uVar18);
    uVar20 = CONCAT16((0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76),uVar19);
    auVar61 = ZEXT416(0x7050301);
    auVar27 = pshufb(auVar27,auVar61);
    uVar41 = (undefined4)((uint5)uVar18 >> 8);
    uVar2 = CONCAT44(uVar41,uVar41);
    auVar89._8_4_ = 0;
    auVar89._0_8_ = uVar2;
    auVar89 = auVar89 << 0x20;
    auVar39._8_4_ =
         (int)(CONCAT18((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58),
                        CONCAT17((0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57),
                                 uVar20)) >> 0x28);
    auVar39._0_8_ = uVar2;
    auVar39._12_4_ = 0;
    auVar40._8_8_ =
         (undefined8)
         (CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45((int)(CONCAT36((int3)(CONCAT27((
                                                  short)(CONCAT18(auVar27[7],CONCAT17(cVar7,uVar20))
                                                        >> 0x38),CONCAT16(auVar27[6],uVar19)) >>
                                                  0x30),CONCAT15(cVar6,uVar18)) >> 0x28),
                                                  CONCAT14(auVar27[5],uVar16)) >> 0x20),
                                                  CONCAT13(cVar5,uVar14)) >> 0x18),
                                   CONCAT12(auVar27[4],uVar13)) >> 0x10),CONCAT11(cVar4,cVar7)) >> 8
         );
    auVar40[7] = auVar27[3];
    auVar40[6] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
    auVar40[5] = auVar27[2];
    auVar40[4] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
    auVar40[3] = auVar27[1];
    auVar40[2] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
    auVar40[1] = auVar27[0];
    auVar40[0] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
    auVar27 = pshufb(auVar59,auVar61);
    auVar96._0_14_ = SUB1614(auVar39 << 0x20,0);
    auVar96[0xe] = cVar11;
    auVar96[0xf] = auVar27[7];
    auVar95._14_2_ = auVar96._14_2_;
    auVar95._0_13_ = SUB1613(auVar39 << 0x20,0);
    auVar95[0xd] = auVar27[6];
    auVar17[8] = cVar10;
    auVar17._0_8_ = uVar2;
    auVar17._9_3_ = auVar95._13_3_;
    auVar94._12_4_ = auVar17._8_4_;
    auVar94._0_11_ = auVar89._0_11_;
    auVar94[0xb] = auVar27[5];
    auVar93._11_5_ = auVar94._11_5_;
    auVar93._0_10_ = auVar89._0_10_;
    auVar93[10] = cVar9;
    auVar92._10_6_ = auVar93._10_6_;
    auVar92._0_9_ = auVar89._0_9_;
    auVar92[9] = auVar27[4];
    auVar15[4] = cVar8;
    auVar15._0_4_ = uVar41;
    auVar15._5_7_ = auVar92._9_7_;
    auVar91._8_8_ = auVar15._4_8_;
    auVar91[7] = auVar27[3];
    auVar91[6] = cVar7;
    auVar91[5] = auVar27[2];
    auVar91[4] = cVar6;
    auVar91[3] = auVar27[1];
    auVar91[2] = cVar5;
    auVar91[1] = auVar27[0];
    auVar91[0] = cVar4;
    cVar4 = (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70);
    cVar5 = (0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72);
    cVar6 = (0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73);
    cVar7 = (0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74);
    cVar8 = (0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75);
    cVar9 = (0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76);
    cVar10 = (0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57);
    bVar12 = (0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58);
    auVar56._0_14_ = ZEXT114(bVar12) << 0x38;
    auVar39 = pshufb(auVar62,auVar61);
    auVar30[0xe] = bVar12;
    auVar30._0_14_ = auVar56._0_14_;
    auVar30[0xf] = auVar39[7];
    auVar29._14_2_ = auVar30._14_2_;
    auVar29._0_13_ = ZEXT113(bVar12) << 0x38;
    auVar29[0xd] = auVar39[6];
    auVar28._13_3_ = auVar29._13_3_;
    auVar28._0_12_ = ZEXT112(bVar12) << 0x38;
    auVar28[0xc] = cVar10;
    auVar90._12_4_ = auVar28._12_4_;
    auVar90._0_11_ = ZEXT111(bVar12) << 0x38;
    auVar90[0xb] = auVar39[5];
    auVar80._11_5_ = auVar90._11_5_;
    auVar80._0_10_ = (unkuint10)bVar12 << 0x38;
    auVar80[10] = cVar9;
    auVar71._10_6_ = auVar80._10_6_;
    auVar71._0_9_ = (unkuint9)bVar12 << 0x38;
    auVar71[9] = auVar39[4];
    auVar61._8_8_ = (undefined8)(CONCAT72(auVar71._9_7_,CONCAT11(cVar8,bVar12)) >> 8);
    auVar61[7] = auVar39[3];
    auVar61[6] = cVar7;
    auVar61[5] = auVar39[2];
    auVar61[4] = cVar6;
    auVar61[3] = auVar39[1];
    auVar61[2] = cVar5;
    auVar61[1] = auVar39[0];
    auVar61[0] = cVar4;
    auVar56[0xe] = bVar12;
    auVar56[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar55._14_2_ = auVar56._14_2_;
    auVar55._0_13_ = ZEXT113(bVar12) << 0x38;
    auVar55[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar54._13_3_ = auVar55._13_3_;
    auVar54._0_12_ = ZEXT112(bVar12) << 0x38;
    auVar54[0xc] = cVar10;
    auVar53._12_4_ = auVar54._12_4_;
    auVar53._0_11_ = ZEXT111(bVar12) << 0x38;
    auVar53[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar52._11_5_ = auVar53._11_5_;
    auVar52._0_10_ = (unkuint10)bVar12 << 0x38;
    auVar52[10] = cVar9;
    auVar51._10_6_ = auVar52._10_6_;
    auVar51._0_9_ = (unkuint9)bVar12 << 0x38;
    auVar51[9] = (char)((ulong)uVar3 >> 0x20);
    auVar50._8_8_ = (undefined8)(CONCAT72(auVar51._9_7_,CONCAT11(cVar8,bVar12)) >> 8);
    auVar50[7] = (char)((ulong)uVar3 >> 0x18);
    auVar50[6] = cVar7;
    auVar50[5] = (char)((ulong)uVar3 >> 0x10);
    auVar50[4] = cVar6;
    auVar50[3] = (char)((ulong)uVar3 >> 8);
    auVar50[2] = cVar5;
    auVar50[1] = (char)uVar3;
    auVar50[0] = cVar4;
    auVar39 = pshufb(auVar50,_DAT_00171720);
    *(long *)pu1_dst = auVar40._0_8_;
    *(long *)(pu1_dst + lVar21) = auVar91._0_8_;
    *(long *)(pu1_dst + lVar21 * 2) = auVar61._0_8_;
    *(long *)(pu1_dst + lVar21 * 3) = auVar39._0_8_;
  }
  else if (log2_trans_size != 0x1f) {
    lVar21 = (long)pred_strd;
    iVar24 = 2 << ((byte)log2_trans_size & 0x1f);
    iVar22 = 0;
    auVar27 = pmovzxbw(in_XMM1,0xffffffffffffffff);
    do {
      lVar23 = 0;
      iVar25 = 0;
      do {
        auVar61 = *(undefined1 (*) [16])(pu1_pred + lVar23) & auVar27;
        auVar80 = *(undefined1 (*) [16])(pu1_pred + lVar23 + lVar21) & auVar27;
        auVar71 = *(undefined1 (*) [16])(pu1_pred + lVar23 + lVar21 * 2) & auVar27;
        auVar90 = *(undefined1 (*) [16])(pu1_pred + lVar23 + lVar21 * 3) & auVar27;
        sVar60 = auVar61._0_2_ + sVar57;
        sVar63 = auVar61._2_2_ + sVar58;
        sVar64 = auVar61._4_2_ + sVar57;
        sVar65 = auVar61._6_2_ + sVar58;
        sVar66 = auVar61._8_2_ + sVar57;
        sVar67 = auVar61._10_2_ + sVar58;
        sVar68 = auVar61._12_2_ + sVar57;
        sVar69 = auVar61._14_2_ + sVar58;
        sVar79 = auVar80._0_2_ + sVar57;
        sVar81 = auVar80._2_2_ + sVar58;
        sVar82 = auVar80._4_2_ + sVar57;
        sVar83 = auVar80._6_2_ + sVar58;
        sVar84 = auVar80._8_2_ + sVar57;
        sVar85 = auVar80._10_2_ + sVar58;
        sVar86 = auVar80._12_2_ + sVar57;
        sVar87 = auVar80._14_2_ + sVar58;
        sVar70 = auVar71._0_2_ + sVar57;
        sVar72 = auVar71._2_2_ + sVar58;
        sVar73 = auVar71._4_2_ + sVar57;
        sVar74 = auVar71._6_2_ + sVar58;
        sVar75 = auVar71._8_2_ + sVar57;
        sVar76 = auVar71._10_2_ + sVar58;
        sVar77 = auVar71._12_2_ + sVar57;
        sVar78 = auVar71._14_2_ + sVar58;
        sVar88 = auVar90._0_2_ + sVar57;
        sVar97 = auVar90._2_2_ + sVar58;
        sVar98 = auVar90._4_2_ + sVar57;
        sVar99 = auVar90._6_2_ + sVar58;
        sVar100 = auVar90._8_2_ + sVar57;
        sVar101 = auVar90._10_2_ + sVar58;
        sVar102 = auVar90._12_2_ + sVar57;
        sVar103 = auVar90._14_2_ + sVar58;
        auVar61 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar23),ZEXT816(0xf0d0b0907050301));
        auVar71 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar23 + dst_strd),auVar39);
        auVar80 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar23 + dst_strd * 2),
                         ZEXT816(0xf0d0b0907050301));
        auVar90 = pshufb(*(undefined1 (*) [16])(pu1_dst + lVar23 + dst_strd * 3),auVar39);
        pUVar1 = pu1_dst + lVar23;
        *pUVar1 = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
        pUVar1[1] = auVar61[0];
        pUVar1[2] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        pUVar1[3] = auVar61[1];
        pUVar1[4] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        pUVar1[5] = auVar61[2];
        pUVar1[6] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        pUVar1[7] = auVar61[3];
        pUVar1[8] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
        pUVar1[9] = auVar61[4];
        pUVar1[10] = (0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67);
        pUVar1[0xb] = auVar61[5];
        pUVar1[0xc] = (0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68);
        pUVar1[0xd] = auVar61[6];
        pUVar1[0xe] = (0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69);
        pUVar1[0xf] = auVar61[7];
        pUVar1 = pu1_dst + lVar23 + dst_strd;
        *pUVar1 = (0 < sVar79) * (sVar79 < 0x100) * (char)sVar79 - (0xff < sVar79);
        pUVar1[1] = auVar71[8];
        pUVar1[2] = (0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81);
        pUVar1[3] = auVar71[9];
        pUVar1[4] = (0 < sVar82) * (sVar82 < 0x100) * (char)sVar82 - (0xff < sVar82);
        pUVar1[5] = auVar71[10];
        pUVar1[6] = (0 < sVar83) * (sVar83 < 0x100) * (char)sVar83 - (0xff < sVar83);
        pUVar1[7] = auVar71[0xb];
        pUVar1[8] = (0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84);
        pUVar1[9] = auVar71[0xc];
        pUVar1[10] = (0 < sVar85) * (sVar85 < 0x100) * (char)sVar85 - (0xff < sVar85);
        pUVar1[0xb] = auVar71[0xd];
        pUVar1[0xc] = (0 < sVar86) * (sVar86 < 0x100) * (char)sVar86 - (0xff < sVar86);
        pUVar1[0xd] = auVar71[0xe];
        pUVar1[0xe] = (0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87);
        pUVar1[0xf] = auVar71[0xf];
        pUVar1 = pu1_dst + lVar23 + dst_strd * 2;
        *pUVar1 = (0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70);
        pUVar1[1] = auVar80[0];
        pUVar1[2] = (0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72);
        pUVar1[3] = auVar80[1];
        pUVar1[4] = (0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73);
        pUVar1[5] = auVar80[2];
        pUVar1[6] = (0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74);
        pUVar1[7] = auVar80[3];
        pUVar1[8] = (0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75);
        pUVar1[9] = auVar80[4];
        pUVar1[10] = (0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76);
        pUVar1[0xb] = auVar80[5];
        pUVar1[0xc] = (0 < sVar77) * (sVar77 < 0x100) * (char)sVar77 - (0xff < sVar77);
        pUVar1[0xd] = auVar80[6];
        pUVar1[0xe] = (0 < sVar78) * (sVar78 < 0x100) * (char)sVar78 - (0xff < sVar78);
        pUVar1[0xf] = auVar80[7];
        pUVar1 = pu1_dst + lVar23 + dst_strd * 3;
        *pUVar1 = (0 < sVar88) * (sVar88 < 0x100) * (char)sVar88 - (0xff < sVar88);
        pUVar1[1] = auVar90[8];
        pUVar1[2] = (0 < sVar97) * (sVar97 < 0x100) * (char)sVar97 - (0xff < sVar97);
        pUVar1[3] = auVar90[9];
        pUVar1[4] = (0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98);
        pUVar1[5] = auVar90[10];
        pUVar1[6] = (0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99);
        pUVar1[7] = auVar90[0xb];
        pUVar1[8] = (0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100);
        pUVar1[9] = auVar90[0xc];
        pUVar1[10] = (0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101);
        pUVar1[0xb] = auVar90[0xd];
        pUVar1[0xc] = (0 < sVar102) * (sVar102 < 0x100) * (char)sVar102 - (0xff < sVar102);
        pUVar1[0xd] = auVar90[0xe];
        pUVar1[0xe] = (0 < sVar103) * (sVar103 < 0x100) * (char)sVar103 - (0xff < sVar103);
        pUVar1[0xf] = auVar90[0xf];
        iVar25 = iVar25 + 8;
        lVar23 = lVar23 + 0x10;
      } while (iVar25 < iVar26);
      pu1_pred = pu1_pred + lVar23 + (pred_strd * 4 - iVar24);
      pu1_dst = pu1_dst + lVar23 + (dst_strd * 4 - iVar24);
      iVar22 = iVar22 + 4;
    } while (iVar22 < iVar26);
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma_ssse3(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                         WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    WORD32 shuffle_mask_4x4 = 0x06040200;
    WORD32 unchanged_mask_4x4 = 0x07050301;
    LWORD64 shuffle_mask = 0x0E0C0A0806040200LL;
    LWORD64 unchanged_mask = 0x0F0D0B0907050301LL;

    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_cvtsi32_si128(shuffle_mask_4x4);
        chroma_unchanged_mask_16x8b = _mm_cvtsi32_si128(unchanged_mask_4x4);

        /*Load the prediction data*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_10  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
        m_temp_reg_11  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
        m_temp_reg_12  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
        m_temp_reg_13  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

        m_temp_reg_14 = _mm_unpacklo_epi32(m_temp_reg_10, m_temp_reg_11);
        m_temp_reg_15 = _mm_unpacklo_epi32(m_temp_reg_12, m_temp_reg_13);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_14, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_15, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_dst);
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_dst + 2 * dst_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_dst + 3 * dst_strd));

        m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
        m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
        m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
        m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);


        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);
        m_temp_reg_9 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_0);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_10 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_1);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_11 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_2);
        m_temp_reg_8 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_8, m_temp_reg_3);

        /*Store the result in the destination*/
        _mm_storel_epi64(pi4_dst, m_temp_reg_9);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);


        _mm_storel_epi64(pi4_dst, m_temp_reg_10);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_11);
        pu1_dst += dst_strd;
        pi4_dst = (__m128i *)(pu1_dst);

        _mm_storel_epi64(pi4_dst, m_temp_reg_12);
    }
    else
    {
        WORD32 i, j;
        __m128i chroma_shuffle_mask_16x8b;
        __m128i chroma_unchanged_mask_16x8b;
        chroma_shuffle_mask_16x8b = _mm_loadl_epi64((__m128i *)(&shuffle_mask));
        chroma_unchanged_mask_16x8b =
                        _mm_loadl_epi64((__m128i *)(&unchanged_mask));

        for(i = 0; i < trans_size; i += 4)
        {
            for(j = 0; j < trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_pred + 3 * pred_strd));

                /*Retain only one chroma component*/
                m_temp_reg_4  = _mm_shuffle_epi8(m_temp_reg_0, chroma_shuffle_mask_16x8b);
                m_temp_reg_5  = _mm_shuffle_epi8(m_temp_reg_1, chroma_shuffle_mask_16x8b);
                m_temp_reg_6  = _mm_shuffle_epi8(m_temp_reg_2, chroma_shuffle_mask_16x8b);
                m_temp_reg_7  = _mm_shuffle_epi8(m_temp_reg_3, chroma_shuffle_mask_16x8b);

                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_6, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_7, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);


                /*Load the recon data to make sure that 'v' is not corrupted when 'u' is called and vice versa*/
                m_temp_reg_0 = _mm_loadu_si128((__m128i *)pu1_dst);
                m_temp_reg_1 = _mm_loadu_si128((__m128i *)(pu1_dst + dst_strd));
                m_temp_reg_2 = _mm_loadu_si128((__m128i *)(pu1_dst + 2 * dst_strd));
                m_temp_reg_3 = _mm_loadu_si128((__m128i *)(pu1_dst + 3 * dst_strd));

                m_temp_reg_0  = _mm_shuffle_epi8(m_temp_reg_0, chroma_unchanged_mask_16x8b);
                m_temp_reg_1  = _mm_shuffle_epi8(m_temp_reg_1, chroma_unchanged_mask_16x8b);
                m_temp_reg_2  = _mm_shuffle_epi8(m_temp_reg_2, chroma_unchanged_mask_16x8b);
                m_temp_reg_3  = _mm_shuffle_epi8(m_temp_reg_3, chroma_unchanged_mask_16x8b);

                m_temp_reg_4 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                m_temp_reg_5 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);

                m_temp_reg_12 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_0);
                m_temp_reg_4 = _mm_srli_si128(m_temp_reg_4, 8);
                m_temp_reg_13 = _mm_unpacklo_epi8(m_temp_reg_4, m_temp_reg_1);

                m_temp_reg_14 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_2);
                m_temp_reg_5 = _mm_srli_si128(m_temp_reg_5, 8);
                m_temp_reg_15 = _mm_unpacklo_epi8(m_temp_reg_5, m_temp_reg_3);

                /*Store the result in the destination*/
                pi4_dst = (__m128i *)(pu1_dst);

                _mm_storel_epi64(pi4_dst, m_temp_reg_12);
                m_temp_reg_8 = _mm_srli_si128(m_temp_reg_12, 8);

                pi4_dst = (__m128i *)(pu1_dst + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_13);
                m_temp_reg_9 = _mm_srli_si128(m_temp_reg_13, 8);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_9);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_14);
                m_temp_reg_10 = _mm_srli_si128(m_temp_reg_14, 8);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_10);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                _mm_storel_epi64(pi4_dst, m_temp_reg_15);
                m_temp_reg_11 = _mm_srli_si128(m_temp_reg_15, 8);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd + 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_11);

                pu1_pred += 16;
                pu1_dst += 16;
            }

            pu1_pred += 4 * pred_strd - 2 * trans_size;
            pu1_dst += 4 * dst_strd - 2 * trans_size;
        }
    }


}